

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_bitsel_ppc(void *d,void *a,void *b,void *c,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(ulong *)((long)d + uVar2) =
         (*(ulong *)((long)b + uVar2) ^ *(ulong *)((long)c + uVar2)) & *(ulong *)((long)a + uVar2) ^
         *(ulong *)((long)c + uVar2);
    uVar2 = uVar2 + 8;
  } while (uVar2 < uVar1 + 8);
  if (uVar1 < (desc >> 2 & 0xf8)) {
    helper_gvec_bitsel_ppc_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_bitsel)(void *d, void *a, void *b, void *c, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        uint64_t aa = *(uint64_t *)((char *)a + i);
        uint64_t bb = *(uint64_t *)((char *)b + i);
        uint64_t cc = *(uint64_t *)((char *)c + i);
        *(uint64_t *)((char *)d + i) = (bb & aa) | (cc & ~aa);
    }
    clear_high(d, oprsz, desc);
}